

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O1

Vec_Vec_t * Gia_ManLevelize(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int Level;
  Vec_Vec_t *p_00;
  void **ppvVar3;
  undefined8 *puVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  Gia_Obj_t *pObj;
  long lVar8;
  
  uVar2 = Gia_ManLevelNum(p);
  uVar1 = uVar2 + 1;
  p_00 = (Vec_Vec_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar2) {
    uVar5 = uVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = uVar5;
  if (uVar5 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)(int)uVar5 << 3);
  }
  p_00->pArray = ppvVar3;
  if (-1 < (int)uVar2) {
    uVar6 = 0;
    do {
      puVar4 = (undefined8 *)malloc(0x10);
      *puVar4 = 0;
      puVar4[1] = 0;
      ppvVar3[uVar6] = puVar4;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  p_00->nSize = uVar1;
  if (0 < p->nObjs) {
    lVar8 = 0;
    lVar7 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return p_00;
      }
      pObj = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar8);
      if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
        Level = Gia_ObjLevel(p,pObj);
        if ((int)uVar2 < Level) {
          __assert_fail("Level <= nLevels",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDfs.c"
                        ,0x19d,"Vec_Vec_t *Gia_ManLevelize(Gia_Man_t *)");
        }
        Vec_VecPush(p_00,Level,pObj);
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0xc;
    } while (lVar7 < p->nObjs);
  }
  return p_00;
}

Assistant:

Vec_Vec_t * Gia_ManLevelize( Gia_Man_t * p )
{ 
    Gia_Obj_t * pObj;
    Vec_Vec_t * vLevels;
    int nLevels, Level, i;
    nLevels = Gia_ManLevelNum( p );
    vLevels = Vec_VecStart( nLevels + 1 );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Level = Gia_ObjLevel( p, pObj );
        assert( Level <= nLevels );
        Vec_VecPush( vLevels, Level, pObj );
    }
    return vLevels;
}